

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

double time_oc<trng::lcg64>(lcg64 *r)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  double dVar4;
  string res;
  string local_38;
  double local_18;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  uVar2 = (r->S).r;
  dVar4 = 0.0;
  lVar3 = 0x1000000;
  do {
    uVar2 = uVar2 * (r->P).a + (r->P).b;
    dVar4 = dVar4 + (double)(uVar2 >> 1) * -1.0842021724855042e-19 + 1.0;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  (r->S).r = uVar2;
  lVar3 = std::chrono::_V2::system_clock::now();
  local_18 = 16.777216 / ((double)((lVar3 - lVar1) / 1000) * 1e-06);
  to_string<double>(&local_38,&local_18);
  while (local_38._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_38);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_38._M_dataplus._M_p,local_38._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return dVar4;
}

Assistant:

double time_oc(R &r) {
  double s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += trng::utility::uniformoc<double>(r);
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}